

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

Point3f pbrt::SampleSphericalRectangle
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point2f *u,Float *pdf)

{
  Tuple3<pbrt::Point3,_float> TVar1;
  int iVar2;
  float *pfVar3;
  Vector3<float> *in_RDI;
  Tuple2<pbrt::Point2,_float> *in_R8;
  float *in_R9;
  long *in_FS_OFFSET;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar9 [16];
  float fVar7;
  double dVar8;
  undefined1 auVar40 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar24 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar25 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar26 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 extraout_var_05 [56];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 extraout_var_06 [56];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 extraout_var_07 [56];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  Vector3<float> VVar41;
  Vector3f VVar42;
  Point3<float> PVar43;
  Float yv;
  Float hvsq;
  Float hv;
  Float h1;
  Float h0;
  Float dd;
  Float xu;
  Float cu;
  Float fu;
  Float au;
  Float b1;
  Float b0;
  Float solidAngle;
  Float g3;
  Float g2;
  Float g1;
  Float g0;
  Vector3f n3;
  Vector3f n2;
  Vector3f n1;
  Vector3f n0;
  Vector3f v11;
  Vector3f v10;
  Vector3f v01;
  Vector3f v00;
  Float y1;
  Float x1;
  Float y0;
  Float x0;
  Float z0;
  Vector3f dLocal;
  Frame R;
  Float eyl;
  Float exl;
  undefined8 in_stack_fffffffffffffb38;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  float in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  float in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  Vector3<float> *in_stack_fffffffffffffb78;
  Vector3f *in_stack_fffffffffffffb80;
  Vector3f *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  undefined1 local_404 [12];
  undefined8 local_3f8;
  float local_3f0;
  float local_3e8;
  float local_3e4;
  float local_3e0;
  float local_3dc;
  float local_3d8;
  float local_3d4;
  float local_3d0;
  float local_3cc;
  float local_3c8;
  float local_3c4;
  float local_3c0;
  float local_3bc;
  undefined8 local_3a8;
  float local_3a0;
  undefined8 local_398;
  float local_390;
  undefined8 local_388;
  float local_380;
  undefined8 local_378;
  float local_370;
  undefined8 local_368;
  float local_360;
  undefined8 local_358;
  float local_350;
  float local_348;
  float local_344 [5];
  undefined8 local_330;
  float local_328;
  undefined8 local_320;
  float local_318;
  undefined8 local_310;
  float local_308;
  undefined8 local_300;
  float local_2f8;
  undefined8 local_2f0;
  float local_2e8;
  undefined8 local_2e0;
  float local_2d8;
  __0 local_2c5;
  float local_2c4;
  undefined8 local_2c0;
  float local_2b8;
  undefined8 local_2b0;
  float local_2a8;
  Float local_2a4;
  undefined8 local_2a0;
  float local_298;
  undefined8 local_290;
  float local_288;
  Float local_284;
  undefined8 local_280;
  float local_278;
  undefined8 local_270;
  float local_268;
  Float local_264;
  undefined8 local_260;
  float local_258;
  undefined8 local_250;
  float local_248;
  Float local_244;
  undefined8 local_240;
  float local_238;
  undefined8 local_230;
  float local_228;
  undefined8 local_220;
  float local_218;
  undefined8 local_210;
  float local_208;
  undefined8 local_200;
  float local_1f8;
  undefined8 local_1f0;
  float local_1e8;
  undefined8 local_1e0;
  float local_1d8;
  undefined8 local_1d0;
  float local_1c8;
  undefined8 local_1c0;
  float local_1b8;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  float local_198;
  undefined8 local_190;
  float local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  float local_168;
  undefined8 local_160;
  float local_158;
  undefined8 local_150;
  float local_148;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  float local_e4;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b4;
  float local_ac;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_54;
  float local_4c;
  type local_48;
  type local_44;
  float *local_40;
  Tuple2<pbrt::Point2,_float> *local_38;
  Vector3<float> *local_18;
  undefined8 local_c;
  float local_4;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_08 [56];
  
  local_40 = in_R9;
  local_38 = in_R8;
  local_18 = in_RDI;
  local_44 = Length<float>((Vector3<float> *)0x5cf284);
  local_48 = Length<float>((Vector3<float> *)0x5cf29a);
  auVar40 = (undefined1  [56])0x0;
  VVar41 = Tuple3<pbrt::Vector3,float>::operator/
                     ((Tuple3<pbrt::Vector3,_float> *)
                      CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                      in_stack_fffffffffffffb4c);
  local_80 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar40;
  local_88 = vmovlpd_avx(auVar10._0_16_);
  auVar40 = (undefined1  [56])0x0;
  local_78 = local_88;
  local_70 = local_80;
  VVar41 = Tuple3<pbrt::Vector3,float>::operator/
                     ((Tuple3<pbrt::Vector3,_float> *)
                      CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                      in_stack_fffffffffffffb4c);
  local_a0 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar40;
  local_a8 = vmovlpd_avx(auVar11._0_16_);
  local_98 = local_a8;
  local_90 = local_a0;
  Frame::FromXY(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  VVar41 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50)
                      ,(Point3<float> *)
                       CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_c8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar40;
  local_d0 = vmovlpd_avx(auVar12._0_16_);
  local_c0 = local_d0;
  local_b8 = local_c8;
  VVar42 = Frame::ToLocal((Frame *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                          (Vector3f *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58))
  ;
  local_e4 = VVar42.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._0_8_ = VVar42.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar40;
  local_e0 = vmovlpd_avx(auVar13._0_16_);
  auVar40 = (undefined1  [56])0x0;
  local_d8 = local_e4;
  local_b4 = local_e0;
  local_ac = local_e4;
  if (0.0 < local_e4) {
    VVar41 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffb40);
    local_f8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar14._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar14._8_56_ = auVar40;
    local_100 = vmovlpd_avx(auVar14._0_16_);
    local_e4 = local_e4 * -1.0;
    local_f0 = local_100;
    local_e8 = local_f8;
    local_54 = local_100;
    local_4c = local_f8;
  }
  local_104 = (float)local_b4;
  local_108 = local_b4._4_4_;
  local_10c = (float)local_b4 + local_44;
  local_110 = local_b4._4_4_ + local_48;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffb40,
             (float)((ulong)in_stack_fffffffffffffb38 >> 0x20),(float)in_stack_fffffffffffffb38,0.0)
  ;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffb40,
             (float)((ulong)in_stack_fffffffffffffb38 >> 0x20),(float)in_stack_fffffffffffffb38,0.0)
  ;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffb40,
             (float)((ulong)in_stack_fffffffffffffb38 >> 0x20),(float)in_stack_fffffffffffffb38,0.0)
  ;
  auVar40 = (undefined1  [56])0x0;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffb40,
             (float)((ulong)in_stack_fffffffffffffb38 >> 0x20),(float)in_stack_fffffffffffffb38,0.0)
  ;
  VVar41 = Cross<float>((Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_168 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15._8_56_ = auVar40;
  local_170 = vmovlpd_avx(auVar15._0_16_);
  local_160 = local_170;
  local_158 = local_168;
  VVar41 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  local_178 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar40;
  local_180 = vmovlpd_avx(auVar16._0_16_);
  local_150 = local_180;
  local_148 = local_178;
  VVar41 = Cross<float>((Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_1a8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar40;
  local_1b0 = vmovlpd_avx(auVar17._0_16_);
  local_1a0 = local_1b0;
  local_198 = local_1a8;
  VVar41 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  local_1b8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18._8_56_ = auVar40;
  local_1c0 = vmovlpd_avx(auVar18._0_16_);
  local_190 = local_1c0;
  local_188 = local_1b8;
  VVar41 = Cross<float>((Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_1e8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar19._8_56_ = auVar40;
  local_1f0 = vmovlpd_avx(auVar19._0_16_);
  local_1e0 = local_1f0;
  local_1d8 = local_1e8;
  VVar41 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  local_1f8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._8_56_ = auVar40;
  local_200 = vmovlpd_avx(auVar20._0_16_);
  local_1d0 = local_200;
  local_1c8 = local_1f8;
  VVar41 = Cross<float>((Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_228 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._8_56_ = auVar40;
  local_230 = vmovlpd_avx(auVar21._0_16_);
  local_220 = local_230;
  local_218 = local_228;
  VVar41 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  local_238 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar22._8_56_ = auVar40;
  local_240 = vmovlpd_avx(auVar22._0_16_);
  local_210 = local_240;
  local_208 = local_238;
  VVar41 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffb40);
  local_258 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar23._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar23._8_56_ = auVar40;
  local_260 = vmovlpd_avx(auVar23._0_16_);
  local_250 = local_260;
  local_248 = local_258;
  local_244 = AngleBetween<float>(in_stack_fffffffffffffb78,
                                  (Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  auVar40 = extraout_var_01;
  VVar41 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffb40);
  local_278 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar24._8_56_ = auVar40;
  local_280 = vmovlpd_avx(auVar24._0_16_);
  local_270 = local_280;
  local_268 = local_278;
  local_264 = AngleBetween<float>(in_stack_fffffffffffffb78,
                                  (Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  auVar40 = extraout_var_02;
  VVar41 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffb40);
  local_298 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar25._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar25._8_56_ = auVar40;
  local_2a0 = vmovlpd_avx(auVar25._0_16_);
  local_290 = local_2a0;
  local_288 = local_298;
  local_284 = AngleBetween<float>(in_stack_fffffffffffffb78,
                                  (Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  auVar40 = extraout_var_03;
  VVar41 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffb40);
  local_2b8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar26._8_56_ = auVar40;
  local_2c0 = vmovlpd_avx(auVar26._0_16_);
  local_2b0 = local_2c0;
  local_2a8 = local_2b8;
  local_2a4 = AngleBetween<float>(in_stack_fffffffffffffb78,
                                  (Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  local_2c4 = (local_244 + local_264 + local_284 + local_2a4) - 6.2831855;
  if ((SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
       ::reg == '\0') &&
     (iVar2 = __cxa_guard_acquire(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
                                   ::reg), iVar2 != 0)) {
    SampleSphericalRectangle(pbrt::Point3_const&,pbrt::Point3_const&,pbrt::Vector3_const&,pbrt::Vector3_const&,pbrt::Point2_const&,float*)
    ::$_0::operator_cast_to_function_pointer(&local_2c5);
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (AccumFunc)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               (PixelAccumFunc)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
    __cxa_guard_release(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
                         ::reg);
  }
  *(long *)(*in_FS_OFFSET + -0x448) = *(long *)(*in_FS_OFFSET + -0x448) + 1;
  if (local_2c4 <= 0.0) {
    *(long *)(*in_FS_OFFSET + -0x450) = *(long *)(*in_FS_OFFSET + -0x450) + 1;
    if (local_40 != (float *)0x0) {
      *local_40 = 0.0;
    }
    Tuple2<pbrt::Point2,_float>::operator[](local_38,0);
    auVar40 = extraout_var_04;
    VVar41 = operator*(in_stack_fffffffffffffb64,
                       (Tuple3<pbrt::Vector3,_float> *)
                       CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    local_2f8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar27._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar27._8_56_ = auVar40;
    local_300 = vmovlpd_avx(auVar27._0_16_);
    local_2f0 = local_300;
    local_2e8 = local_2f8;
    PVar43 = Point3<float>::operator+
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    local_308 = PVar43.super_Tuple3<pbrt::Point3,_float>.z;
    auVar28._0_8_ = PVar43.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar28._8_56_ = auVar40;
    local_310 = vmovlpd_avx(auVar28._0_16_);
    local_2e0 = local_310;
    local_2d8 = local_308;
    Tuple2<pbrt::Point2,_float>::operator[](local_38,1);
    auVar40 = extraout_var_05;
    VVar41 = operator*(in_stack_fffffffffffffb64,
                       (Tuple3<pbrt::Vector3,_float> *)
                       CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    local_328 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar29._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar29._8_56_ = auVar40;
    local_330 = vmovlpd_avx(auVar29._0_16_);
    local_320 = local_330;
    local_318 = local_328;
    PVar43 = Point3<float>::operator+
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    local_4 = PVar43.super_Tuple3<pbrt::Point3,_float>.z;
    auVar30._0_8_ = PVar43.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar30._8_56_ = auVar40;
    local_c = vmovlpd_avx(auVar30._0_16_);
  }
  else {
    if (local_40 != (float *)0x0) {
      local_344[0] = 0.0;
      local_348 = 1.0 / local_2c4;
      pfVar3 = std::max<float>(local_344,&local_348);
      *local_40 = *pfVar3;
    }
    if (0.001 <= local_2c4) {
      local_3bc = local_148;
      local_3c0 = local_1c8;
      auVar35._0_4_ = Tuple2<pbrt::Point2,_float>::operator[](local_38,0);
      auVar35._4_60_ = extraout_var;
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_2c4),auVar35._0_16_,ZEXT416((uint)-local_284));
      local_3c4 = auVar9._0_4_ - local_2a4;
      auVar36._0_8_ = std::cos((double)(ulong)(uint)local_3c4);
      auVar36._8_56_ = extraout_var_08;
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_3bc),auVar36._0_16_,ZEXT416((uint)-local_3c0));
      fVar4 = auVar9._0_4_;
      dVar8 = std::sin((double)(ulong)(uint)local_3c4);
      local_3c8 = fVar4 / SUB84(dVar8,0);
      fVar5 = Sqr<float>(local_3c8);
      fVar6 = Sqr<float>(local_3bc);
      dVar8 = std::sqrt((double)(ulong)(uint)(fVar5 + fVar6));
      auVar9._0_4_ = 1.0 / SUB84(dVar8,0);
      auVar9._4_12_ = SUB6012((undefined1  [60])0x0,0);
      dVar8 = std::copysign(auVar9._0_8_,(double)(ulong)(uint)local_3c8);
      local_3cc = SUB84(dVar8,0);
      local_3cc = Clamp<float,float,float>(local_3cc,-0.99999994,0.99999994);
      fVar5 = -(local_3cc * local_e4);
      Sqr<float>(local_3cc);
      local_3d0 = SafeSqrt(0.0);
      local_3d0 = fVar5 / local_3d0;
      local_3d0 = Clamp<float,float,float>(local_3d0,local_104,local_10c);
      fVar5 = Sqr<float>(local_3d0);
      fVar6 = Sqr<float>(local_e4);
      dVar8 = std::sqrt((double)(ulong)(uint)(fVar5 + fVar6));
      local_3d4 = SUB84(dVar8,0);
      fVar5 = local_108;
      fVar6 = Sqr<float>(local_3d4);
      fVar7 = Sqr<float>(local_108);
      dVar8 = std::sqrt((double)(ulong)(uint)(fVar6 + fVar7));
      local_3d8 = fVar5 / SUB84(dVar8,0);
      fVar5 = local_110;
      fVar6 = Sqr<float>(local_3d4);
      fVar7 = Sqr<float>(local_110);
      dVar8 = std::sqrt((double)(ulong)(uint)(fVar6 + fVar7));
      local_3dc = fVar5 / SUB84(dVar8,0);
      fVar5 = local_3d8;
      auVar37._0_4_ = Tuple2<pbrt::Point2,_float>::operator[](local_38,1);
      auVar37._4_60_ = extraout_var_00;
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)(local_3dc - local_3d8)),auVar37._0_16_,
                               ZEXT416((uint)fVar5));
      local_3e0 = auVar9._0_4_;
      local_3e4 = Sqr<float>(local_3e0);
      fVar5 = local_110;
      if (local_3e4 < 0.999999) {
        in_stack_fffffffffffffb4c = local_3e0 * local_3d4;
        dVar8 = std::sqrt((double)(ulong)(uint)(1.0 - local_3e4));
        fVar5 = in_stack_fffffffffffffb4c / SUB84(dVar8,0);
      }
      auVar40 = (undefined1  [56])0x0;
      local_3e8 = fVar5;
      Vector3<float>::Vector3(local_18,(float)((ulong)local_404 >> 0x20),SUB84(local_404,0),0.0);
      VVar42 = Frame::FromLocal((Frame *)CONCAT44(in_stack_fffffffffffffbe4,
                                                  in_stack_fffffffffffffbe0),
                                in_stack_fffffffffffffbd8);
      local_3f0 = VVar42.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar38._0_8_ = VVar42.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar38._8_56_ = auVar40;
      local_3f8 = vmovlpd_avx(auVar38._0_16_);
      PVar43 = Point3<float>::operator+
                         ((Point3<float> *)CONCAT44(fVar4,fVar5),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      local_4 = PVar43.super_Tuple3<pbrt::Point3,_float>.z;
      auVar39._0_8_ = PVar43.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar39._8_56_ = auVar40;
      local_c = vmovlpd_avx(auVar39._0_16_);
    }
    else {
      Tuple2<pbrt::Point2,_float>::operator[](local_38,0);
      auVar40 = extraout_var_06;
      VVar41 = operator*(in_stack_fffffffffffffb64,
                         (Tuple3<pbrt::Vector3,_float> *)
                         CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      local_370 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar31._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar31._8_56_ = auVar40;
      local_378 = vmovlpd_avx(auVar31._0_16_);
      local_368 = local_378;
      local_360 = local_370;
      PVar43 = Point3<float>::operator+
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      local_380 = PVar43.super_Tuple3<pbrt::Point3,_float>.z;
      auVar32._0_8_ = PVar43.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar32._8_56_ = auVar40;
      local_388 = vmovlpd_avx(auVar32._0_16_);
      local_358 = local_388;
      local_350 = local_380;
      Tuple2<pbrt::Point2,_float>::operator[](local_38,1);
      auVar40 = extraout_var_07;
      VVar41 = operator*(in_stack_fffffffffffffb64,
                         (Tuple3<pbrt::Vector3,_float> *)
                         CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      local_3a0 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar33._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar33._8_56_ = auVar40;
      local_3a8 = vmovlpd_avx(auVar33._0_16_);
      local_398 = local_3a8;
      local_390 = local_3a0;
      PVar43 = Point3<float>::operator+
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      local_4 = PVar43.super_Tuple3<pbrt::Point3,_float>.z;
      auVar34._0_8_ = PVar43.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar34._8_56_ = auVar40;
      local_c = vmovlpd_avx(auVar34._0_16_);
    }
  }
  TVar1.z = local_4;
  TVar1.x = (float)(undefined4)local_c;
  TVar1.y = (float)local_c._4_4_;
  return (Point3f)TVar1;
}

Assistant:

Point3f SampleSphericalRectangle(const Point3f &pRef, const Point3f &s,
                                 const Vector3f &ex, const Vector3f &ey, const Point2f &u,
                                 Float *pdf) {
    // Compute local reference frame and transform rectangle coordinates
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);
    Vector3f dLocal = R.ToLocal(s - pRef);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float x0 = dLocal.x, y0 = dLocal.y;
    Float x1 = x0 + exl, y1 = y0 + eyl;

    // Find plane normals to rectangle edges and compute internal angles
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);
    Vector3f n0 = Normalize(Cross(v00, v10)), n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01)), n3 = Normalize(Cross(v01, v00));
    Float g0 = AngleBetween(-n0, n1), g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3), g3 = AngleBetween(-n3, n0);

    // Compute spherical rectangle solid angle and PDF
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;
    CHECK_RARE(1e-5, solidAngle <= 0);
    if (solidAngle <= 0) {
        if (pdf != nullptr)
            *pdf = 0;
        return Point3f(s + u[0] * ex + u[1] * ey);
    }
    if (pdf != nullptr)
        *pdf = std::max<Float>(0, 1 / solidAngle);
    if (solidAngle < 1e-3)
        return Point3f(s + u[0] * ex + u[1] * ey);

    // Sample _cu_ for spherical rectangle sample
    Float b0 = n0.z, b1 = n2.z;
    // Float au = u[0] * solidAngle + k;   // original
    Float au = u[0] * solidAngle - g2 - g3;
    Float fu = (std::cos(au) * b0 - b1) / std::sin(au);
    Float cu = std::copysign(1 / std::sqrt(Sqr(fu) + Sqr(b0)), fu);
    cu = Clamp(cu, -OneMinusEpsilon, OneMinusEpsilon);  // avoid NaNs

    // Find _xu_ along $x$ edge for spherical rectangle sample
    Float xu = -(cu * z0) / SafeSqrt(1 - Sqr(cu));
    xu = Clamp(xu, x0, x1);

    // Find _xv_ along $y$ edge for spherical rectangle sample
    Float dd = std::sqrt(Sqr(xu) + Sqr(z0));
    Float h0 = y0 / std::sqrt(Sqr(dd) + Sqr(y0));
    Float h1 = y1 / std::sqrt(Sqr(dd) + Sqr(y1));
    Float hv = h0 + u[1] * (h1 - h0), hvsq = Sqr(hv);
    Float yv = (hvsq < 1 - 1e-6f) ? (hv * dd) / std::sqrt(1 - hvsq) : y1;

    // Return spherical triangle sample in original coordinate system
    return pRef + R.FromLocal(Vector3f(xu, yv, z0));
}